

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O0

char * google::protobuf::FastHexToBuffer(int i,char *buffer)

{
  char *pcVar1;
  LogMessage *pLVar2;
  char *local_70;
  char *p;
  byte local_51;
  LogMessage local_50;
  char *local_18;
  char *buffer_local;
  int i_local;
  
  local_51 = 0;
  local_18 = buffer;
  buffer_local._4_4_ = i;
  if (i < 0) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/stubs/strutil.cc"
               ,0x377);
    local_51 = 1;
    pLVar2 = internal::LogMessage::operator<<(&local_50,"CHECK failed: i >= 0: ");
    pLVar2 = internal::LogMessage::operator<<
                       (pLVar2,"FastHexToBuffer() wants non-negative integers, not ");
    pLVar2 = internal::LogMessage::operator<<(pLVar2,buffer_local._4_4_);
    internal::LogFinisher::operator=((LogFinisher *)((long)&p + 3),pLVar2);
  }
  if ((local_51 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_50);
  }
  local_18[0x15] = '\0';
  pcVar1 = local_18 + 0x14;
  do {
    local_70 = pcVar1;
    *local_70 = FastHexToBuffer::hexdigits[(int)(buffer_local._4_4_ & 0xf)];
    buffer_local._4_4_ = (int)buffer_local._4_4_ >> 4;
    pcVar1 = local_70 + -1;
  } while (0 < (int)buffer_local._4_4_);
  return local_70;
}

Assistant:

char *FastHexToBuffer(int i, char* buffer) {
  GOOGLE_CHECK(i >= 0) << "FastHexToBuffer() wants non-negative integers, not " << i;

  static const char *hexdigits = "0123456789abcdef";
  char *p = buffer + 21;
  *p-- = '\0';
  do {
    *p-- = hexdigits[i & 15];   // mod by 16
    i >>= 4;                    // divide by 16
  } while (i > 0);
  return p + 1;
}